

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::Desugarer::desugarFile
          (Desugarer *this,AST **ast,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
          *tlas)

{
  pointer pcVar1;
  AST *pAVar2;
  DesugaredObject *body_00;
  _Rb_tree_node_base *p_Var3;
  Identifier *pIVar4;
  Var *pVVar5;
  Apply *a;
  LiteralString *b;
  Local *pLVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  initializer_list<jsonnet::internal::FodderElement> __l;
  initializer_list<jsonnet::internal::FodderElement> __l_00;
  UString local_178;
  Identifier *body;
  bool local_14a;
  bool local_149;
  Tokens tokens;
  LocationRange tla_loc;
  undefined8 local_f0;
  ArgParams args;
  Apply *local_b8;
  Fodder line_end;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  empty;
  Fodder line_end_blank;
  Var *local_48;
  Var *local_40;
  Conditional *local_38;
  
  desugar(this,ast,0);
  pcVar1 = ((*ast)->location).file._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + ((*ast)->location).file._M_string_length);
  body_00 = stdlibAST(this,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  empty.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FodderElement::FodderElement((FodderElement *)&tla_loc,LINE_END,1,0,&empty);
  __l._M_len = 1;
  __l._M_array = (iterator)&tla_loc;
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::vector(&line_end_blank,__l,(allocator_type *)&local_178);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tla_loc.file.field_2);
  FodderElement::FodderElement((FodderElement *)&tla_loc,LINE_END,0,0,&empty);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&tla_loc;
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::vector(&line_end,__l_00,(allocator_type *)&local_178);
  paVar7 = &tla_loc.file.field_2;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)paVar7);
  if (tlas != (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
               *)0x0) {
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"Top-level function","");
    tla_loc.file._M_dataplus._M_p = (pointer)paVar7;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&tla_loc,local_178._M_dataplus._M_p,
               local_178._M_string_length + (long)local_178._M_dataplus._M_p);
    tla_loc.end.line = 0;
    tla_loc.end.column = 0;
    tla_loc.begin.line = 0;
    tla_loc.begin.column = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    args.
    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    args.
    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    args.
    super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var3 = (tlas->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var3 != &(tlas->_M_t)._M_impl.super__Rb_tree_header) {
      if ((char)p_Var3[3]._M_color == _S_black) {
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_178,"tla:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var3 + 1));
        jsonnet_lex(&tokens,(string *)&local_178,*(char **)(p_Var3 + 2));
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        body = (Identifier *)jsonnet_parse(this->alloc,&tokens);
        desugar(this,(AST **)&body,0);
        ::std::__cxx11::
        _List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>::_M_clear
                  (&tokens.
                    super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                  );
      }
      else {
        decode_utf8(&local_178,(string *)(p_Var3 + 2));
        tokens.super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
        ._M_impl._M_node.super__List_node_base._M_next =
             (_List_node_base *)
             CONCAT44(tokens.
                      super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
                      ._M_impl._M_node.super__List_node_base._M_next._4_4_,5);
        body = (Identifier *)
               Allocator::
               make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                         (this->alloc,(LocationRange *)E,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_178,(TokenKind *)&tokens,(char (*) [1])0x2647dd,
                          (char (*) [1])0x2647dd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity * 4 + 4
                         );
        }
      }
      decode_utf8(&local_178,(string *)(p_Var3 + 1));
      tokens.super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>.
      _M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)Allocator::makeIdentifier(this->alloc,&local_178);
      ::std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>::
      emplace_back<std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                ((vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>> *)
                 &args,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)EF,(Identifier **)&tokens,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)EF,(AST **)&body,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)EF);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity * 4 + 4);
      }
      p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3);
    }
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    ::std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)&local_178,L"top_level",L"");
    pIVar4 = Allocator::makeIdentifier(this->alloc,&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity * 4 + 4);
    }
    pAVar2 = *ast;
    body = pIVar4;
    singleBind((Binds *)&tokens,this,pIVar4,pAVar2);
    local_178._M_dataplus._M_p = (pointer)body;
    pVVar5 = Allocator::
             make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Identifier_const*&>
                       (this->alloc,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,(Identifier **)&local_178);
    a = type(this,&pVVar5->super_AST);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    ::std::__cxx11::u32string::_M_construct<char32_t_const*>
              ((u32string *)&local_178,L"function",L"");
    local_f0 = (Apply *)CONCAT44(local_f0._4_4_,5);
    b = Allocator::
        make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                  (this->alloc,(LocationRange *)E,
                   (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    *)EF,&local_178,(TokenKind *)&local_f0,(char (*) [1])0x2647dd,
                   (char (*) [1])0x2647dd);
    local_b8 = primitiveEquals(this,(LocationRange *)E,&a->super_AST,&b->super_AST);
    local_40 = Allocator::
               make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                         (this->alloc,(LocationRange *)E,&line_end,&body);
    local_149 = false;
    local_14a = false;
    local_f0 = Allocator::
               make<jsonnet::internal::Apply,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                         (this->alloc,&tla_loc,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&local_40,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,&args,&local_149,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                 *)EF,&local_14a);
    local_48 = Allocator::
               make<jsonnet::internal::Var,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                         (this->alloc,(LocationRange *)E,&line_end,&body);
    local_38 = Allocator::
               make<jsonnet::internal::Conditional,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Apply*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Var*>
                         (this->alloc,(LocationRange *)E,&line_end,&local_b8,
                          (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           *)EF,(Apply **)&local_f0,&line_end,&local_48);
    pLVar6 = Allocator::
             make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::Conditional*>
                       (this->alloc,&pAVar2->location,&line_end_blank,
                        (vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                         *)&tokens,&local_38);
    *ast = &pLVar6->super_AST;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity * 4 + 4);
    }
    ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
             *)&tokens);
    ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
    ~vector(&args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tla_loc.file._M_dataplus._M_p != &tla_loc.file.field_2) {
      operator_delete(tla_loc.file._M_dataplus._M_p,tla_loc.file.field_2._M_allocated_capacity + 1);
    }
  }
  paVar7 = &tla_loc.file.field_2;
  pAVar2 = *ast;
  tla_loc.file._M_dataplus._M_p = (pointer)paVar7;
  ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&tla_loc,L"std",L"");
  pIVar4 = Allocator::makeIdentifier(this->alloc,(UString *)&tla_loc);
  pVVar5 = std(this);
  singleBind((Binds *)&local_178,this,pIVar4,&pVVar5->super_AST);
  pLVar6 = Allocator::
           make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                     (this->alloc,&pAVar2->location,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                             *)&local_178,ast);
  *ast = &pLVar6->super_AST;
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *
          )&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tla_loc.file._M_dataplus._M_p != paVar7) {
    operator_delete(tla_loc.file._M_dataplus._M_p,tla_loc.file.field_2._M_allocated_capacity * 4 + 4
                   );
  }
  pAVar2 = *ast;
  tla_loc.file._M_dataplus._M_p = (pointer)paVar7;
  ::std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&tla_loc,L"$std",L"");
  pIVar4 = Allocator::makeIdentifier(this->alloc,(UString *)&tla_loc);
  singleBind((Binds *)&local_178,this,pIVar4,&body_00->super_AST);
  pLVar6 = Allocator::
           make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>,jsonnet::internal::AST*&>
                     (this->alloc,&pAVar2->location,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
                             *)&local_178,ast);
  *ast = &pLVar6->super_AST;
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  ~vector((vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> *
          )&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tla_loc.file._M_dataplus._M_p != paVar7) {
    operator_delete(tla_loc.file._M_dataplus._M_p,tla_loc.file.field_2._M_allocated_capacity * 4 + 4
                   );
  }
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&line_end);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&line_end_blank);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&empty);
  return;
}

Assistant:

void desugarFile(AST *&ast, std::map<std::string, VmExt> *tlas)
    {
        desugar(ast, 0);

        DesugaredObject *std_obj = stdlibAST(ast->location.file);

        std::vector<std::string> empty;
        auto line_end_blank = Fodder{{FodderElement::LINE_END, 1, 0, empty}};
        auto line_end = Fodder{{FodderElement::LINE_END, 0, 0, empty}};

        // local body = ast;
        // if std.type(body) == "function") then
        //     body(tlas...)
        // else
        //     body
        if (tlas != nullptr) {
            LocationRange tla_loc("Top-level function");
            ArgParams args;
            for (const auto &pair : *tlas) {
                AST *expr;
                if (pair.second.isCode) {
                    Tokens tokens = jsonnet_lex("tla:" + pair.first, pair.second.data.c_str());
                    expr = jsonnet_parse(alloc, tokens);
                    desugar(expr, 0);
                } else {
                    expr = str(decode_utf8(pair.second.data));
                }
                // Add them as named arguments, so order does not matter.
                args.emplace_back(EF, id(decode_utf8(pair.first)), EF, expr, EF);
            }
            const Identifier *body = id(U"top_level");
            ast =
                make<Local>(ast->location,
                            line_end_blank,
                            singleBind(body, ast),
                            make<Conditional>(E,
                                              line_end,
                                              primitiveEquals(E, type(var(body)), str(U"function")),
                                              EF,
                                              make<Apply>(tla_loc,
                                                          EF,
                                                          make<Var>(E, line_end, body),
                                                          EF,
                                                          args,
                                                          false,  // trailing comma
                                                          EF,
                                                          EF,
                                                          false  // tailstrict
                                                          ),
                                              line_end,
                                              make<Var>(E, line_end, body)));
        }

        // local $std = (std.jsonnet stuff); std = $std; ast
        // The standard library is bound to $std, which cannot be overriden,
        // so redefining std won't break expressions that desugar to calls
        // to standard library functions.
        ast = make<Local>(ast->location, EF, singleBind(id(U"std"), std()), ast);
        ast = make<Local>(ast->location, EF, singleBind(id(U"$std"), std_obj), ast);
    }